

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::ByteSizeLong(BorderAmounts_EdgeSizes *this)

{
  bool bVar1;
  int size;
  uint64_t uVar2;
  size_t sVar3;
  long lVar4;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  BorderAmounts_EdgeSizes *this_local;
  
  _cached_size = 0;
  uVar2 = _internal_startedgesize(this);
  if (uVar2 != 0) {
    uVar2 = _internal_startedgesize(this);
    _cached_size = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar2);
  }
  uVar2 = _internal_endedgesize(this);
  if (uVar2 != 0) {
    uVar2 = _internal_endedgesize(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar2);
    _cached_size = sVar3 + _cached_size;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    _cached_size = lVar4 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t BorderAmounts_EdgeSizes::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // uint64 startEdgeSize = 1;
  if (this->_internal_startedgesize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_startedgesize());
  }

  // uint64 endEdgeSize = 2;
  if (this->_internal_endedgesize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_endedgesize());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}